

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

void helper_neon_qunzip8_aarch64(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *vd;
  uVar2 = *(ulong *)((long)vd + 8);
  uVar3 = *vm;
  uVar4 = *(ulong *)((long)vm + 8);
  *(ulong *)vm = uVar2 & 0xff00000000000000 |
                 (ulong)((uint)(uVar1 >> 0x20) & 0xff000000) |
                 uVar1 >> 0x18 & 0xff0000 | uVar1 >> 0x10 & 0xff00 | uVar1 >> 8 & 0xff |
                 uVar2 << 0x18 & 0xff00000000 | uVar2 << 0x10 & 0xff0000000000 |
                 uVar2 << 8 & 0xff000000000000;
  *(ulong *)((long)vm + 8) =
       uVar4 & 0xff00000000000000 |
       (ulong)((uint)(uVar3 >> 0x20) & 0xff000000) |
       uVar3 >> 0x18 & 0xff0000 | uVar3 >> 0x10 & 0xff00 | uVar3 >> 8 & 0xff |
       uVar4 << 0x18 & 0xff00000000 | uVar4 << 0x10 & 0xff0000000000 | uVar4 << 8 & 0xff000000000000
  ;
  *(ulong *)vd = uVar2 << 8 & 0xff00000000000000 |
                 uVar2 << 0x10 & 0xff000000000000 |
                 uVar2 << 0x18 & 0xff0000000000 |
                 (uVar2 & 0xff) << 0x20 |
                 (ulong)((uint)(uVar1 >> 0x18) & 0xff000000) |
                 uVar1 >> 0x10 & 0xff0000 | uVar1 >> 8 & 0xff00 | uVar1 & 0xff;
  *(ulong *)((long)vd + 8) =
       uVar4 << 8 & 0xff00000000000000 |
       uVar4 << 0x10 & 0xff000000000000 |
       uVar4 << 0x18 & 0xff0000000000 |
       (uVar4 & 0xff) << 0x20 |
       (ulong)((uint)(uVar3 >> 0x18) & 0xff000000) |
       uVar3 >> 0x10 & 0xff0000 | uVar3 >> 8 & 0xff00 | uVar3 & 0xff;
  return;
}

Assistant:

void HELPER(neon_qunzip8)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd0 = rd[0], zd1 = rd[1];
    uint64_t zm0 = rm[0], zm1 = rm[1];

    uint64_t d0 = ELEM(zd0, 0, 8) | (ELEM(zd0, 2, 8) << 8)
        | (ELEM(zd0, 4, 8) << 16) | (ELEM(zd0, 6, 8) << 24)
        | (ELEM(zd1, 0, 8) << 32) | (ELEM(zd1, 2, 8) << 40)
        | (ELEM(zd1, 4, 8) << 48) | (ELEM(zd1, 6, 8) << 56);
    uint64_t d1 = ELEM(zm0, 0, 8) | (ELEM(zm0, 2, 8) << 8)
        | (ELEM(zm0, 4, 8) << 16) | (ELEM(zm0, 6, 8) << 24)
        | (ELEM(zm1, 0, 8) << 32) | (ELEM(zm1, 2, 8) << 40)
        | (ELEM(zm1, 4, 8) << 48) | (ELEM(zm1, 6, 8) << 56);
    uint64_t m0 = ELEM(zd0, 1, 8) | (ELEM(zd0, 3, 8) << 8)
        | (ELEM(zd0, 5, 8) << 16) | (ELEM(zd0, 7, 8) << 24)
        | (ELEM(zd1, 1, 8) << 32) | (ELEM(zd1, 3, 8) << 40)
        | (ELEM(zd1, 5, 8) << 48) | (ELEM(zd1, 7, 8) << 56);
    uint64_t m1 = ELEM(zm0, 1, 8) | (ELEM(zm0, 3, 8) << 8)
        | (ELEM(zm0, 5, 8) << 16) | (ELEM(zm0, 7, 8) << 24)
        | (ELEM(zm1, 1, 8) << 32) | (ELEM(zm1, 3, 8) << 40)
        | (ELEM(zm1, 5, 8) << 48) | (ELEM(zm1, 7, 8) << 56);

    rm[0] = m0;
    rm[1] = m1;
    rd[0] = d0;
    rd[1] = d1;
}